

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

char32_t *
fmt::v8::detail::
parse_width<char32_t,fmt::v8::detail::specs_checker<fmt::v8::detail::specs_handler<char32_t>>&>
          (char32_t *begin,char32_t *end,
          specs_checker<fmt::v8::detail::specs_handler<char32_t>_> *handler)

{
  int iVar1;
  char32_t *begin_00;
  char32_t *local_58;
  width_adapter local_50;
  undefined1 local_48 [40];
  
  local_58 = begin;
  if (begin == end) {
    fmt::v8::detail::assert_fail
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
               ,0x943,"");
  }
  if ((uint)(*begin + L'\xffffffd0') < 10) {
    iVar1 = parse_nonnegative_int<char32_t>(&local_58,end,-1);
    if (iVar1 == -1) {
      fmt::v8::detail::throw_format_error("number is too big");
    }
    ((handler->super_specs_handler<char32_t>).super_specs_setter<char32_t>.specs_)->width = iVar1;
  }
  else if (*begin == L'{') {
    begin_00 = begin + 1;
    if (begin_00 != end) {
      local_50.handler = handler;
      if ((*begin_00 == L':') || (*begin_00 == L'}')) {
        specs_handler<char32_t>::get_arg(local_48,&handler->super_specs_handler<char32_t>);
        iVar1 = get_dynamic_spec<fmt::v8::detail::width_checker,fmt::v8::basic_format_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,char32_t>>,fmt::v8::detail::error_handler>
                          ();
        ((handler->super_specs_handler<char32_t>).super_specs_setter<char32_t>.specs_)->width =
             iVar1;
      }
      else {
        begin_00 = do_parse_arg_id<char32_t,fmt::v8::detail::parse_width<char32_t,fmt::v8::detail::specs_checker<fmt::v8::detail::specs_handler<char32_t>>&>(char32_t_const*,char32_t_const*,fmt::v8::detail::specs_checker<fmt::v8::detail::specs_handler<char32_t>>&)::width_adapter&>
                             (begin_00,end,&local_50);
      }
    }
    if ((begin_00 == end) || (*begin_00 != L'}')) {
      fmt::v8::detail::throw_format_error("invalid format string");
    }
    local_58 = begin_00 + 1;
  }
  return local_58;
}

Assistant:

FMT_CONSTEXPR auto parse_width(const Char* begin, const Char* end,
                               Handler&& handler) -> const Char* {
  using detail::auto_id;
  struct width_adapter {
    Handler& handler;

    FMT_CONSTEXPR void operator()() { handler.on_dynamic_width(auto_id()); }
    FMT_CONSTEXPR void operator()(int id) { handler.on_dynamic_width(id); }
    FMT_CONSTEXPR void operator()(basic_string_view<Char> id) {
      handler.on_dynamic_width(id);
    }
    FMT_CONSTEXPR void on_error(const char* message) {
      if (message) handler.on_error(message);
    }
  };

  FMT_ASSERT(begin != end, "");
  if ('0' <= *begin && *begin <= '9') {
    int width = parse_nonnegative_int(begin, end, -1);
    if (width != -1)
      handler.on_width(width);
    else
      handler.on_error("number is too big");
  } else if (*begin == '{') {
    ++begin;
    if (begin != end) begin = parse_arg_id(begin, end, width_adapter{handler});
    if (begin == end || *begin != '}')
      return handler.on_error("invalid format string"), begin;
    ++begin;
  }
  return begin;
}